

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmHexFileConverter.cxx
# Opt level: O1

uint ChompStrlen(char *line)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  
  if (line != (char *)0x0) {
    sVar2 = strlen(line);
    uVar3 = (uint)sVar2 - 1;
    if ((line[uVar3] == '\r') || (uVar1 = (uint)sVar2, line[uVar3] == '\n')) {
      uVar1 = uVar3;
    }
    if ((line[uVar1 - 1] == '\r') || (line[uVar1 - 1] == '\n')) {
      uVar1 = uVar1 - 1;
    }
    return uVar1;
  }
  return 0;
}

Assistant:

static unsigned int ChompStrlen(const char* line)
{
  if (line == nullptr) {
    return 0;
  }
  unsigned int length = static_cast<unsigned int>(strlen(line));
  if ((line[length - 1] == '\n') || (line[length - 1] == '\r')) {
    length--;
  }
  if ((line[length - 1] == '\n') || (line[length - 1] == '\r')) {
    length--;
  }
  return length;
}